

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O3

void __thiscall
hexdump_reader::perform(hexdump_reader *this,filesystemcollection *fslist,readercollection *rdlist)

{
  undefined8 *puVar1;
  ReadWriter_ptr rd;
  ReadWriter_ptr local_38;
  element_type *local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  
  if (1 < g_verbose) {
    printf("dohexdump(%s, %08llx, %08zx, %08zx, %s)\n",(this->_readername)._M_dataplus._M_p,
           this->_ofs,this->_storedsize,this->_fullsize,(this->_comptype)._M_dataplus._M_p);
  }
  readercollection::getbyname((readercollection *)&local_28,(string *)rdlist);
  if (local_28 != (element_type *)0x0) {
    (*local_28->_vptr_ReadWriter[4])(local_28,this->_ofs);
    if ((this->_comptype)._M_string_length == 0) {
      local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_28;
      local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           local_20;
      if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_20->_M_use_count = local_20->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_20->_M_use_count = local_20->_M_use_count + 1;
        }
      }
      dorawhexdump(this,&local_38);
      if (local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_38.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
    }
    if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
    }
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "hexdump: invalid rdname";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

virtual void perform(filesystemcollection& fslist, readercollection& rdlist)
    {
        if (g_verbose>1)
            printf("dohexdump(%s, %08llx, %08zx, %08zx, %s)\n", _readername.c_str(), _ofs, _storedsize, _fullsize, _comptype.c_str());

        ReadWriter_ptr rd= rdlist.getbyname(_readername);
        if (!rd) throw "hexdump: invalid rdname";

        rd->setpos(_ofs);

        if (_comptype.empty())
            dorawhexdump(rd);
#ifndef _NO_COMPRESS
        else
            docomphexdump(rd);
#endif
    }